

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

pid_t kwsysProcessFork(cmsysProcess *cp,kwsysProcessCreateInformation *si)

{
  __pid_t _Var1;
  ssize_t sVar2;
  int *piVar3;
  bool bVar4;
  int local_30;
  __pid_t local_2c;
  int status;
  pid_t child_pid_1;
  pid_t child_pid;
  pid_t middle_pid;
  kwsysProcessCreateInformation *si_local;
  cmsysProcess *cp_local;
  
  _child_pid = si;
  si_local = (kwsysProcessCreateInformation *)cp;
  if (cp->OptionDetach == 0) {
    cp_local._4_4_ = fork();
  }
  else {
    child_pid_1 = fork();
    cp_local._4_4_ = child_pid_1;
    if (-1 < child_pid_1) {
      if (child_pid_1 == 0) {
        status = fork();
        if (status == 0) {
          cp_local._4_4_ = 0;
        }
        else {
          do {
            sVar2 = write(_child_pid->ErrorPipe[1],&status,4);
            bVar4 = false;
            if (sVar2 < 0) {
              piVar3 = __errno_location();
              bVar4 = *piVar3 == 4;
            }
          } while (bVar4);
          kwsysProcessExit();
          cp_local._4_4_ = 0;
        }
      }
      else {
        do {
          sVar2 = read(_child_pid->ErrorPipe[0],&local_2c,4);
          bVar4 = false;
          if (sVar2 < 0) {
            piVar3 = __errno_location();
            bVar4 = *piVar3 == 4;
          }
        } while (bVar4);
        do {
          _Var1 = waitpid(child_pid_1,&local_30,0);
          bVar4 = false;
          if (_Var1 < 0) {
            piVar3 = __errno_location();
            bVar4 = *piVar3 == 4;
          }
        } while (bVar4);
        cp_local._4_4_ = local_2c;
      }
    }
  }
  return cp_local._4_4_;
}

Assistant:

static pid_t kwsysProcessFork(kwsysProcess* cp,
                              kwsysProcessCreateInformation* si)
{
  /* Create a detached process if requested.  */
  if(cp->OptionDetach)
    {
    /* Create an intermediate process.  */
    pid_t middle_pid = fork();
    if(middle_pid < 0)
      {
      /* Fork failed.  Return as if we were not detaching.  */
      return middle_pid;
      }
    else if(middle_pid == 0)
      {
      /* This is the intermediate process.  Create the real child.  */
      pid_t child_pid = fork();
      if(child_pid == 0)
        {
        /* This is the real child process.  There is nothing to do here.  */
        return 0;
        }
      else
        {
        /* Use the error pipe to report the pid to the real parent.  */
        while((write(si->ErrorPipe[1], &child_pid, sizeof(child_pid)) < 0) &&
              (errno == EINTR));

        /* Exit without cleanup.  The parent holds all resources.  */
        kwsysProcessExit();
        return 0; /* Never reached, but avoids SunCC warning.  */
        }
      }
    else
      {
      /* This is the original parent process.  The intermediate
         process will use the error pipe to report the pid of the
         detached child.  */
      pid_t child_pid;
      int status;
      while((read(si->ErrorPipe[0], &child_pid, sizeof(child_pid)) < 0) &&
            (errno == EINTR));

      /* Wait for the intermediate process to exit and clean it up.  */
      while((waitpid(middle_pid, &status, 0) < 0) && (errno == EINTR));
      return child_pid;
      }
    }
  else
    {
    /* Not creating a detached process.  Use normal fork.  */
    return fork();
    }
}